

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void tidyPrintTidyLanguageNames(ctmbstr format)

{
  TidyIterator local_20;
  TidyIterator i;
  ctmbstr item;
  ctmbstr format_local;
  
  item = format;
  local_20 = getInstalledLanguageList();
  while (local_20 != (TidyIterator)0x0) {
    i = (TidyIterator)getNextInstalledLanguage(&local_20);
    if (item == (ctmbstr)0x0) {
      printf("%s\n",i);
    }
    else {
      printf(item,i);
    }
  }
  return;
}

Assistant:

void tidyPrintTidyLanguageNames( ctmbstr format )
{
    ctmbstr item;
    TidyIterator i = getInstalledLanguageList();

    while (i) {
        item = getNextInstalledLanguage(&i);
        if ( format )
            printf( format, item );
        else
            printf( "%s\n", item );
    }
}